

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools.cpp
# Opt level: O2

AbstractTool * CreateTool(string *arg)

{
  __type _Var1;
  FilterTool *this;
  
  _Var1 = std::operator==(arg,&CONVERT_abi_cxx11_);
  if (_Var1) {
    this = (FilterTool *)operator_new(0x18);
    BamTools::ConvertTool::ConvertTool((ConvertTool *)this);
  }
  else {
    _Var1 = std::operator==(arg,&COUNT_abi_cxx11_);
    if (_Var1) {
      this = (FilterTool *)operator_new(0x18);
      BamTools::CountTool::CountTool((CountTool *)this);
    }
    else {
      _Var1 = std::operator==(arg,&COVERAGE_abi_cxx11_);
      if (_Var1) {
        this = (FilterTool *)operator_new(0x18);
        BamTools::CoverageTool::CoverageTool((CoverageTool *)this);
      }
      else {
        _Var1 = std::operator==(arg,&FILTER_abi_cxx11_);
        if (_Var1) {
          this = (FilterTool *)operator_new(0x18);
          BamTools::FilterTool::FilterTool(this);
        }
        else {
          _Var1 = std::operator==(arg,&HEADER_abi_cxx11_);
          if (_Var1) {
            this = (FilterTool *)operator_new(0x18);
            BamTools::HeaderTool::HeaderTool((HeaderTool *)this);
          }
          else {
            _Var1 = std::operator==(arg,&INDEX_abi_cxx11_);
            if (_Var1) {
              this = (FilterTool *)operator_new(0x18);
              BamTools::IndexTool::IndexTool((IndexTool *)this);
            }
            else {
              _Var1 = std::operator==(arg,&MERGE_abi_cxx11_);
              if (_Var1) {
                this = (FilterTool *)operator_new(0x18);
                BamTools::MergeTool::MergeTool((MergeTool *)this);
              }
              else {
                _Var1 = std::operator==(arg,&RANDOM_abi_cxx11_);
                if (_Var1) {
                  this = (FilterTool *)operator_new(0x18);
                  BamTools::RandomTool::RandomTool((RandomTool *)this);
                }
                else {
                  _Var1 = std::operator==(arg,&RESOLVE_abi_cxx11_);
                  if (_Var1) {
                    this = (FilterTool *)operator_new(0x18);
                    BamTools::ResolveTool::ResolveTool((ResolveTool *)this);
                  }
                  else {
                    _Var1 = std::operator==(arg,&REVERT_abi_cxx11_);
                    if (_Var1) {
                      this = (FilterTool *)operator_new(0x18);
                      BamTools::RevertTool::RevertTool((RevertTool *)this);
                    }
                    else {
                      _Var1 = std::operator==(arg,&SORT_abi_cxx11_);
                      if (_Var1) {
                        this = (FilterTool *)operator_new(0x18);
                        BamTools::SortTool::SortTool((SortTool *)this);
                      }
                      else {
                        _Var1 = std::operator==(arg,&SPLIT_abi_cxx11_);
                        if (_Var1) {
                          this = (FilterTool *)operator_new(0x18);
                          BamTools::SplitTool::SplitTool((SplitTool *)this);
                        }
                        else {
                          _Var1 = std::operator==(arg,&STATS_abi_cxx11_);
                          if (_Var1) {
                            this = (FilterTool *)operator_new(0x18);
                            BamTools::StatsTool::StatsTool((StatsTool *)this);
                          }
                          else {
                            this = (FilterTool *)0x0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return &this->super_AbstractTool;
}

Assistant:

AbstractTool* CreateTool(const std::string& arg)
{

    // determine tool type based on arg
    if (arg == CONVERT) {
        return new ConvertTool;
    }
    if (arg == COUNT) {
        return new CountTool;
    }
    if (arg == COVERAGE) {
        return new CoverageTool;
    }
    if (arg == FILTER) {
        return new FilterTool;
    }
    if (arg == HEADER) {
        return new HeaderTool;
    }
    if (arg == INDEX) {
        return new IndexTool;
    }
    if (arg == MERGE) {
        return new MergeTool;
    }
    if (arg == RANDOM) {
        return new RandomTool;
    }
    if (arg == RESOLVE) {
        return new ResolveTool;
    }
    if (arg == REVERT) {
        return new RevertTool;
    }
    if (arg == SORT) {
        return new SortTool;
    }
    if (arg == SPLIT) {
        return new SplitTool;
    }
    if (arg == STATS) {
        return new StatsTool;
    }

    // unknown arg
    return 0;
}